

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O2

void sorter_sqrt_sort_merge_right(int64_t *arr,int L1,int L2,int M)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long *plVar5;
  uint uVar6;
  ulong uVar7;
  
  iVar1 = L2 + L1 + -1;
  uVar6 = L1 - 1;
  iVar3 = M + L2 + L1;
  plVar5 = arr + (L2 + L1 + M);
  while( true ) {
    iVar3 = iVar3 + -1;
    plVar5 = plVar5 + -1;
    if ((int)uVar6 < 0) break;
    uVar7 = (ulong)uVar6;
    if ((iVar1 < L1) || (lVar2 = arr[iVar1], lVar2 < arr[uVar7])) {
      uVar6 = uVar6 - 1;
      lVar2 = arr[uVar7];
    }
    else {
      iVar1 = iVar1 + -1;
    }
    *plVar5 = lVar2;
  }
  if (iVar3 != iVar1) {
    lVar4 = (long)iVar3;
    for (lVar2 = (long)iVar1; L1 <= lVar2; lVar2 = lVar2 + -1) {
      arr[lVar4] = arr[lVar2];
      lVar4 = lVar4 + -1;
    }
  }
  return;
}

Assistant:

static void SQRT_SORT_MERGE_RIGHT(SORT_TYPE *arr, int L1, int L2, int M) {
  int p0 = L1 + L2 + M - 1, p2 = L1 + L2 - 1, p1 = L1 - 1;

  while (p1 >= 0) {
    if (p2 < L1 || SORT_CMP_A(arr + p1, arr + p2) > 0) {
      arr[p0--] = arr[p1--];
    } else {
      arr[p0--] = arr[p2--];
    }
  }

  if (p2 != p0)
    while (p2 >= L1) {
      arr[p0--] = arr[p2--];
    }
}